

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppAVar7;
  CmdLineParseException *pCVar8;
  ExitException *ee_1;
  ArgException *e;
  ExitException *ee;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  _List_node_base *local_70;
  _Self local_68;
  _Self local_60;
  ArgListIterator it;
  uint local_50;
  int iStack_4c;
  bool matched;
  int i;
  int requiredCount;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  const_iterator local_38;
  int local_20;
  byte local_19;
  int estat;
  bool shouldExit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  CmdLine *this_local;
  
  local_19 = 0;
  local_20 = 0;
  _estat = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(args);
  std::__cxx11::string::operator=((string *)&this->_progName,(string *)pvVar4);
  this_00 = _estat;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(_estat);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_38,&local_40);
  _i = std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::erase(this_00,local_38);
  iStack_4c = 0;
  local_50 = 0;
  do {
    uVar5 = (ulong)local_50;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(_estat);
    if (sVar6 <= uVar5) {
      if (iStack_4c < this->_numRequired) {
        missingArgsException(this);
      }
      if (iStack_4c <= this->_numRequired) {
        if ((local_19 & 1) == 0) {
          return;
        }
        exit(local_20);
      }
      ee._6_1_ = 1;
      pCVar8 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Too many arguments!",&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"undefined",(allocator *)((long)&ee + 7));
      CmdLineParseException::CmdLineParseException(pCVar8,(string *)local_b8,(string *)local_e0);
      ee._6_1_ = 0;
      __cxa_throw(pCVar8,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    it._M_node._7_1_ = 0;
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
    while( true ) {
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
      bVar1 = std::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      ppAVar7 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_60);
      uVar2 = (*(*ppAVar7)->_vptr_Arg[3])(*ppAVar7,&local_50,_estat);
      if ((uVar2 & 1) != 0) {
        ppAVar7 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_60);
        iVar3 = XorHandler::check(&this->_xorHandler,*ppAVar7);
        iStack_4c = iVar3 + iStack_4c;
        it._M_node._7_1_ = 1;
        break;
      }
      local_70 = (_List_node_base *)std::_List_iterator<TCLAP::Arg_*>::operator++(&local_60,0);
    }
    if ((it._M_node._7_1_ & 1) == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_estat,(long)(int)local_50);
      bVar1 = _emptyCombined(this,pvVar4);
      if (bVar1) {
        it._M_node._7_1_ = 1;
      }
    }
    if (((it._M_node._7_1_ & 1) == 0) && (bVar1 = Arg::ignoreRest(), !bVar1)) {
      local_92 = 1;
      pCVar8 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Couldn\'t find match for argument",&local_91);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_estat,(long)(int)local_50);
      CmdLineParseException::CmdLineParseException(pCVar8,(string *)local_90,pvVar4);
      local_92 = 0;
      __cxa_throw(pCVar8,&CmdLineParseException::typeinfo,
                  CmdLineParseException::~CmdLineParseException);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;

	try {
		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() )
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}